

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void * __thiscall mpt::content<mpt::metatype_*>::insert(content<mpt::metatype_*> *this,long pos)

{
  void *pvVar1;
  
  if ((pos < 0) && (pos = pos + ((this->super_buffer)._used >> 3), pos < 0)) {
    return (void *)0x0;
  }
  pvVar1 = (void *)mpt::buffer::insert((ulong)this,pos << 3);
  return pvVar1;
}

Assistant:

void *insert(long pos)
	{
		if (pos < 0) {
			pos += _used / sizeof(T);
			if (pos < 0) {
				return 0;
			}
		}
		/* inserted data is NOT initialized */
		return buffer::insert(pos * sizeof(T), sizeof(T));
	}